

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eps_copy_input_stream.h
# Opt level: O2

_Bool upb_EpsCopyInputStream_CheckDataSizeAvailable(upb_EpsCopyInputStream *e,char *ptr,int size)

{
  bool bVar1;
  uintptr_t uptr;
  
  bVar1 = ptr + size <= e->limit_ptr + 0x10 && ptr <= ptr + size;
  if ((size < 0) && (bVar1)) {
    __assert_fail("!ret",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/eps_copy_input_stream.h"
                  ,0xb3,
                  "_Bool _upb_EpsCopyInputStream_CheckSizeAvailable(upb_EpsCopyInputStream *, const char *, int, _Bool)"
                 );
  }
  return bVar1;
}

Assistant:

UPB_INLINE bool _upb_EpsCopyInputStream_CheckSizeAvailable(
    upb_EpsCopyInputStream* e, const char* ptr, int size, bool submessage) {
  // This is one extra branch compared to the more normal:
  //   return (size_t)(end - ptr) < size;
  // However it is one less computation if we are just about to use "ptr + len":
  //   https://godbolt.org/z/35YGPz
  // In microbenchmarks this shows a small improvement.
  uintptr_t uptr = (uintptr_t)ptr;
  uintptr_t uend = (uintptr_t)e->limit_ptr;
  uintptr_t res = uptr + (size_t)size;
  if (!submessage) uend += kUpb_EpsCopyInputStream_SlopBytes;
  // NOTE: this check depends on having a linear address space.  This is not
  // technically guaranteed by uintptr_t.
  bool ret = res >= uptr && res <= uend;
  if (size < 0) UPB_ASSERT(!ret);
  return ret;
}